

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_value.hpp
# Opt level: O2

value_ptr __thiscall
pstore::diff_dump::
make_index_diff<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>(*)(pstore::database&,bool)>
          (diff_dump *this,czstring name,database *db,revision_number new_revision,
          revision_number old_revision,
          _func_shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_database_ptr_bool
          *get_index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar1;
  value_ptr vVar2;
  initializer_list<pstore::dump::object::member> __l;
  char *in_stack_fffffffffffffee0;
  value_ptr local_118;
  value_ptr local_108;
  revision_restorer _;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_e8;
  string local_d0;
  string local_b0;
  member local_90 [2];
  
  if (old_revision <= new_revision) {
    _.db_ = db;
    _.old_revision_ = database::get_current_revision(db);
    database::sync(db);
    std::__cxx11::string::string((string *)&local_b0,"name",(allocator *)&stack0xfffffffffffffee7);
    dump::make_value(in_stack_fffffffffffffee0);
    dump::object::member::member(local_90,&local_b0,&local_108);
    std::__cxx11::string::string
              ((string *)&local_d0,"members",(allocator *)&stack0xfffffffffffffee6);
    make_diff<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>(*)(pstore::database&,bool)>
              ((diff_dump *)&local_118,db,old_revision,get_index);
    dump::object::member::member(local_90 + 1,&local_d0,&local_118);
    __l._M_len = 2;
    __l._M_array = local_90;
    std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
              (&local_e8,__l,(allocator_type *)&stack0xfffffffffffffee5);
    dump::make_value((container *)this);
    std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::
    ~vector(&local_e8);
    lVar1 = 0x30;
    do {
      dump::object::member::~member
                ((member *)((long)&local_90[0].property._M_dataplus._M_p + lVar1));
      lVar1 = lVar1 + -0x30;
    } while (lVar1 != -0x30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_118.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&local_b0);
    details::revision_restorer::~revision_restorer(&_);
    vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (value_ptr)vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
  }
  assert_failed("new_revision >= old_revision",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/diff_dump/diff_value.hpp"
                ,0x9b);
}

Assistant:

dump::value_ptr make_index_diff (gsl::czstring const name, database & db,
                                         revision_number const new_revision,
                                         revision_number const old_revision,
                                         GetIndexFunction get_index) {
            PSTORE_ASSERT (new_revision >= old_revision);

            details::revision_restorer const _{db};
            db.sync (new_revision);

            return dump::make_value (dump::object::container{
                {"name", dump::make_value (name)},
                {"members", make_diff<Index> (db, old_revision, get_index)},
            });
        }